

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::String(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
         *this,Context *context,Ch *str,SizeType length,bool param_4)

{
  bool bVar1;
  undefined8 in_RAX;
  ValueType *actualType;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar2;
  SizeType count;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  if ((this->type_ & 0x10) == 0) {
    actualType = GetStringString();
    DisallowedType(this,context,actualType);
    context->invalidCode = kValidateErrorType;
    this_00 = GetTypeString();
    goto LAB_0012f09c;
  }
  if ((this->minLength_ == 0) && (this->maxLength_ == 0xffffffff)) {
LAB_0012f05a:
    if (this->pattern_ != (RegexType *)0x0) {
      bVar1 = IsPatternMatch(this->pattern_,str,length);
      if (!bVar1) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0xd])
                  (context->error_handler,str,(ulong)length);
        context->invalidCode = kValidateErrorPattern;
        this_00 = GetPatternString();
        goto LAB_0012f09c;
      }
    }
    bVar1 = CreateParallelValidator(this,context);
  }
  else {
    bVar1 = CountStringCodePoint<rapidjson::UTF8<char>>(str,length,&local_24);
    if (!bVar1) goto LAB_0012f05a;
    if (local_24 < this->minLength_) {
      (*context->error_handler->_vptr_IValidationErrorHandler[0xc])
                (context->error_handler,str,(ulong)length);
      context->invalidCode = kValidateErrorMinLength;
      this_00 = GetMinLengthString();
    }
    else {
      if (local_24 <= this->maxLength_) goto LAB_0012f05a;
      (*context->error_handler->_vptr_IValidationErrorHandler[0xb])
                (context->error_handler,str,(ulong)length);
      context->invalidCode = kValidateErrorMaxLength;
      this_00 = GetMaxLengthString();
    }
LAB_0012f09c:
    pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
    context->invalidKeyword = pCVar2;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool String(Context& context, const Ch* str, SizeType length, bool) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::String", str);
        if (!(type_ & (1 << kStringSchemaType))) {
            DisallowedType(context, GetStringString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (minLength_ != 0 || maxLength_ != SizeType(~0)) {
            SizeType count;
            if (internal::CountStringCodePoint<EncodingType>(str, length, &count)) {
                if (count < minLength_) {
                    context.error_handler.TooShort(str, length, minLength_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinLength);
                }
                if (count > maxLength_) {
                    context.error_handler.TooLong(str, length, maxLength_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxLength);
                }
            }
        }

        if (pattern_ && !IsPatternMatch(pattern_, str, length)) {
            context.error_handler.DoesNotMatch(str, length);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPattern);
        }

        return CreateParallelValidator(context);
    }